

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

string * __thiscall embree::Token::String_abi_cxx11_(Token *this)

{
  runtime_error *this_00;
  int *in_RSI;
  string *in_RDI;
  ParseLocation *in_stack_00000028;
  string local_30 [48];
  
  if (*in_RSI == 5) {
    std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 2));
    return in_RDI;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(in_stack_00000028);
  std::operator+(in_RDI,(char *)this_00);
  std::runtime_error::runtime_error(this_00,local_30);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string String() const {
      if (ty == TY_STRING) return str;
      THROW_RUNTIME_ERROR(loc.str()+": string expected");
    }